

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool ParseInt(TidyDocImpl *doc,TidyOptionImpl *entry)

{
  tchar c;
  Bool BVar1;
  bool bVar2;
  Bool BVar3;
  ulong val;
  
  c = SkipWhite(&doc->config);
  BVar3 = no;
  bVar2 = true;
  val = 0;
  while( true ) {
    BVar1 = prvTidyIsDigit(c);
    if (BVar1 == no) break;
    val = val * 10 + (ulong)(c - 0x30);
    c = AdvanceChar(&doc->config);
    bVar2 = false;
    BVar3 = yes;
  }
  if (bVar2) {
    prvTidyReportBadArgument(doc,entry->name);
  }
  else {
    prvTidySetOptionInt(doc,entry->id,val);
  }
  return BVar3;
}

Assistant:

Bool ParseInt( TidyDocImpl* doc, const TidyOptionImpl* entry )
{
    ulong number = 0;
    Bool digits = no;
    TidyConfigImpl* cfg = &doc->config;
    tchar c = SkipWhite( cfg );

    while ( TY_(IsDigit)(c) )
    {
        number = c - '0' + (10 * number);
        digits = yes;
        c = AdvanceChar( cfg );
    }

    if ( !digits )
        TY_(ReportBadArgument)( doc, entry->name );
    else
        TY_(SetOptionInt)( doc, entry->id, number );
    return digits;
}